

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O0

string * __thiscall
google::protobuf::Join<std::vector<int,std::allocator<int>>>
          (string *__return_storage_ptr__,protobuf *this,
          vector<int,_std::allocator<int>_> *components,char *delim)

{
  const_iterator start;
  const_iterator end;
  char *delim_local;
  vector<int,_std::allocator<int>_> *components_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  start = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)this);
  end = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this);
  Join<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             start._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current
             ,(char *)components,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Join(const Range& components,
            const char* delim) {
  string result;
  Join(components.begin(), components.end(), delim, &result);
  return result;
}